

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings(FastText *this,int32_t cutoff)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  anon_class_16_2_b239f476 __comp;
  int32_t iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  Dictionary *this_00;
  const_iterator in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int32_t eosid;
  Vector norms;
  shared_ptr<fasttext::DenseMatrix> input;
  vector<int,_std::allocator<int>_> *idx;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  Matrix *in_stack_ffffffffffffff08;
  allocator_type *__a;
  DenseMatrix *in_stack_ffffffffffffff10;
  const_iterator __last_00;
  Vector *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff40;
  allocator_type local_55;
  undefined4 local_54;
  undefined1 local_4d;
  Vector local_28;
  
  this_01 = &local_28;
  __last_00._M_current = (int *)in_RDI;
  std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>
            ((shared_ptr<fasttext::Matrix> *)in_RDI);
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16ffb8);
  __last._M_current =
       (int *)Matrix::size(in_stack_ffffffffffffff08,
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Vector::Vector(this_01,(int64_t)in_RSI._M_current);
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16ffec);
  DenseMatrix::l2NormRow(in_stack_ffffffffffffff10,(Vector *)in_stack_ffffffffffffff08);
  local_4d = 0;
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x170013);
  this_00 = (Dictionary *)
            Matrix::size(in_stack_ffffffffffffff08,
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_54 = 0;
  __a = &local_55;
  std::allocator<int>::allocator((allocator<int> *)0x170043);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__last_00._M_current,(size_type)in_RDI,
             (value_type_conflict1 *)this_00,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x17006e);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8._M_current);
  __first._M_current._4_4_ = in_stack_ffffffffffffff04;
  __first._M_current._0_4_ = in_stack_ffffffffffffff00;
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first,in_stack_fffffffffffffef8,0);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1700b9);
  iVar1 = Dictionary::getId(this_00,(string *)__a);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8._M_current);
  __comp._8_8_ = this_01;
  __comp.norms = (Vector *)in_RSI._M_current;
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,fasttext::FastText::selectEmbeddings(int)const::__0>
            (in_stack_ffffffffffffff40,__last,__comp);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8._M_current);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)__a,
             CONCAT44(iVar1,in_stack_ffffffffffffff00));
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff00),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffef8._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8._M_current);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff00),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffef8._M_current);
  std::vector<int,_std::allocator<int>_>::erase(in_RDI,in_RSI,__last_00);
  local_4d = 1;
  Vector::~Vector((Vector *)0x17024e);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x17025b)
  ;
  return (vector<int,_std::allocator<int>_> *)__last_00._M_current;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  Vector norms(input->size(0));
  input->l2NormRow(norms);
  std::vector<int32_t> idx(input->size(0), 0);
  std::iota(idx.begin(), idx.end(), 0);
  auto eosid = dict_->getId(Dictionary::EOS);
  std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
    return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
  });
  idx.erase(idx.begin() + cutoff, idx.end());
  return idx;
}